

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PrimaryBlockEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrimaryBlockEventExpressionSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1)

{
  Token keyword;
  PrimaryBlockEventExpressionSyntax *pPVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pPVar1 = (PrimaryBlockEventExpressionSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  keyword.info = in_RSI;
  keyword._0_8_ = in_RDX;
  slang::syntax::PrimaryBlockEventExpressionSyntax::PrimaryBlockEventExpressionSyntax
            ((PrimaryBlockEventExpressionSyntax *)in_RSI->location,keyword,
             (NameSyntax *)in_RSI->rawTextPtr);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }